

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O2

int DSA_generate_key(DSA *a)

{
  int iVar1;
  int iVar2;
  tuple<bignum_ctx_*,_bssl::internal::Deleter> ctx_00;
  BIGNUM *p;
  BIGNUM *rr;
  BN_MONT_CTX *pBVar3;
  UniquePtr<BN_CTX> ctx;
  
  iVar1 = dsa_check_key((DSA *)a);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>)BN_CTX_new();
    ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
         ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
    if (ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_ctx_*,_false>)0x0) {
      iVar1 = 0;
    }
    else {
      p = a->q;
      if ((p == (BIGNUM *)0x0) && (p = BN_new(), p == (BIGNUM *)0x0)) {
        iVar1 = 0;
        rr = (BIGNUM *)0x0;
        p = (BIGNUM *)0x0;
      }
      else {
        iVar2 = BN_rand_range_ex((BIGNUM *)p,1,(BIGNUM *)a->version);
        iVar1 = 0;
        if ((iVar2 == 0) ||
           ((rr = a->p, rr == (BIGNUM *)0x0 && (rr = BN_new(), rr == (BIGNUM *)0x0)))) {
          iVar1 = 0;
          rr = (BIGNUM *)0x0;
        }
        else {
          pBVar3 = BN_MONT_CTX_set_locked
                             ((BN_MONT_CTX **)&a->references,(int)a + 0x28,*(BIGNUM **)a,
                              (BN_CTX *)
                              ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
          if (((int)pBVar3 != 0) &&
             (iVar2 = BN_mod_exp_mont_consttime
                                (rr,*(BIGNUM **)&a->write_params,p,*(BIGNUM **)a,
                                 (BN_CTX *)
                                 ctx_00.
                                 super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                 *(BN_MONT_CTX **)&a->references), iVar2 != 0)) {
            a->q = p;
            a->p = rr;
            iVar1 = 1;
          }
        }
      }
      if (a->p == (BIGNUM *)0x0) {
        BN_free(rr);
      }
      if (a->q == (BIGNUM *)0x0) {
        BN_free(p);
      }
    }
    std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  }
  return iVar1;
}

Assistant:

int DSA_generate_key(DSA *dsa) {
  if (!dsa_check_key(dsa)) {
    return 0;
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }

  int ok = 0;
  BIGNUM *pub_key = nullptr;
  BIGNUM *priv_key = dsa->priv_key;
  if (priv_key == nullptr) {
    priv_key = BN_new();
    if (priv_key == nullptr) {
      goto err;
    }
  }

  if (!BN_rand_range_ex(priv_key, 1, dsa->q)) {
    goto err;
  }

  pub_key = dsa->pub_key;
  if (pub_key == nullptr) {
    pub_key = BN_new();
    if (pub_key == nullptr) {
      goto err;
    }
  }

  if (!BN_MONT_CTX_set_locked(&dsa->method_mont_p, &dsa->method_mont_lock,
                              dsa->p, ctx.get()) ||
      !BN_mod_exp_mont_consttime(pub_key, dsa->g, priv_key, dsa->p, ctx.get(),
                                 dsa->method_mont_p)) {
    goto err;
  }

  // The public key is computed from the private key, but is public.
  bn_declassify(pub_key);

  dsa->priv_key = priv_key;
  dsa->pub_key = pub_key;
  ok = 1;

err:
  if (dsa->pub_key == nullptr) {
    BN_free(pub_key);
  }
  if (dsa->priv_key == nullptr) {
    BN_free(priv_key);
  }

  return ok;
}